

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

AbstractStreamReader *
METADemuxer::createCodec
          (string *codecName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams,string *codecStreamName,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TextSubtitlesRender *pTVar5;
  double dVar6;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo_00;
  char cVar7;
  uint8_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  int iVar11;
  uint32_t uVar12;
  PipCorner PVar13;
  uint uVar14;
  uint uVar15;
  int32_t iVar16;
  VideoAspectRatio VVar17;
  LPCMStreamReader *this;
  _Base_ptr p_Var18;
  const_iterator cVar19;
  long lVar20;
  SimplePacketizerReader *this_00;
  pointer puVar21;
  undefined *puVar22;
  undefined4 *puVar23;
  LPCMStreamReader *pLVar24;
  char *str;
  float fVar25;
  undefined4 uVar26;
  double fps;
  undefined4 uVar27;
  ostringstream ss;
  Font font;
  string secondStr;
  double local_280;
  string local_270 [11];
  char *local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  ulong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  double local_c0;
  TextAnimation local_b8 [2];
  long local_a8 [2];
  uint *local_98;
  undefined8 local_90;
  uint local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint *local_78;
  undefined8 local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *local_38;
  
  local_38 = mplsInfo;
  iVar11 = std::__cxx11::string::compare((char *)codecName);
  if ((iVar11 == 0) || (iVar11 = std::__cxx11::string::compare((char *)codecName), iVar11 == 0)) {
    this = (LPCMStreamReader *)operator_new(0x250);
    H264StreamReader::H264StreamReader((H264StreamReader *)this);
    iVar11 = std::__cxx11::string::compare((char *)codecName);
    if (iVar11 == 0) {
      this->m_tmpFrameBuffer[0x113] = '\x01';
    }
    paVar4 = &local_270[0].field_2;
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
      dVar6 = correctFps(dVar6);
      lVar20 = 0;
      if (0.0 < dVar6) {
        lVar20 = (long)(5292000000.0 / dVar6);
      }
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar20;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar20 / 2;
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"level","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      pLVar24 = (LPCMStreamReader *)0x0;
      if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
          super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader ==
          (_func_int **)&PTR__H264StreamReader_0023d850) {
        pLVar24 = this;
      }
      dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
      pLVar24->m_tmpFrameBuffer[0x21] = (char)(int)dVar6 * '\n';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"insertSEI","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"autoSEI","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"forceSEI","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x02';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    local_270[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"contSPS","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x11] = '\x01';
    }
    goto LAB_001a70bf;
  }
  iVar11 = std::__cxx11::string::compare((char *)codecName);
  if (iVar11 == 0) {
    this = (LPCMStreamReader *)operator_new(0x198);
    HEVCStreamReader::HEVCStreamReader((HEVCStreamReader *)this);
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)codecName);
    if (iVar11 != 0) {
      iVar11 = std::__cxx11::string::compare((char *)codecName);
      if (iVar11 == 0) {
        this = (LPCMStreamReader *)operator_new(0x1f8);
        VC1StreamReader::VC1StreamReader((VC1StreamReader *)this);
        paVar4 = &local_270[0].field_2;
        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&addParams->_M_t,local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270[0]._M_dataplus._M_p != paVar4) {
          operator_delete(local_270[0]._M_dataplus._M_p,
                          local_270[0].field_2._M_allocated_capacity + 1);
        }
        p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
          dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
          dVar6 = correctFps(dVar6);
          lVar20 = 0;
          if (0.0 < dVar6) {
            lVar20 = (long)(5292000000.0 / dVar6);
          }
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar20;
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar20 / 2;
        }
        local_270[0]._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
        cVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&addParams->_M_t,local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270[0]._M_dataplus._M_p != paVar4) {
          operator_delete(local_270[0]._M_dataplus._M_p,
                          local_270[0].field_2._M_allocated_capacity + 1);
        }
        if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
        }
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)codecName);
        if (iVar11 == 0) {
          this = (LPCMStreamReader *)operator_new(600);
          MPEG2StreamReader::MPEG2StreamReader((MPEG2StreamReader *)this);
          paVar4 = &local_270[0].field_2;
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
            dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
            dVar6 = correctFps(dVar6);
            lVar20 = 0;
            if (0.0 < dVar6) {
              lVar20 = (long)(5292000000.0 / dVar6);
            }
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar20;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar20 / 2
            ;
          }
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"ar","");
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
            lVar20 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo
                                    ,0);
            VVar17 = arNameToCode((string *)(cVar19._M_node + 2));
            *(VideoAspectRatio *)(lVar20 + 0x58) = VVar17;
          }
          local_270[0]._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"delPulldown","");
          cVar19 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_270[0]._M_dataplus._M_p,
                            local_270[0].field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
          }
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)codecName);
          if (iVar11 == 0) {
            this = (LPCMStreamReader *)operator_new(0xf8);
            memset(this,0,0xf8);
            SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
            ((iterator *)&this->m_headerType)->_M_cur = (_Elt_pointer)0x0;
            this->m_tmpFrameBuffer[1] = 0;
            this->m_tmpFrameBuffer[5] = 0x80;
            this->m_tmpFrameBuffer[6] = 0xbb;
            this->m_tmpFrameBuffer[7] = '\0';
            this->m_tmpFrameBuffer[8] = '\0';
            *(_Elt_pointer *)(this->m_tmpFrameBuffer + 9) = (_Elt_pointer)0x0;
            *(undefined4 *)(this->m_tmpFrameBuffer + 0x11) = 0;
            puVar22 = &AACStreamReader::vtable;
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)codecName);
            if (iVar11 != 0) {
              iVar11 = std::__cxx11::string::compare((char *)codecName);
              if (iVar11 == 0) {
                this = (LPCMStreamReader *)operator_new(0x100);
                SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
                (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_0023d720
                ;
                *(undefined1 *)&((iterator *)&this->m_headerType)->_M_cur = 1;
                this->m_useNewStyleAudioPES = false;
                this->m_testMode = false;
                this->m_firstFrame = false;
                this->m_tmpFrameBuffer[0] = '\0';
                this->m_tmpFrameBuffer[1] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                *(_Elt_pointer *)(this->m_tmpFrameBuffer + 9) = (_Elt_pointer)0x0;
                *(_Map_pointer *)(this->m_tmpFrameBuffer + 0x11) = (_Map_pointer)0x0;
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)codecName);
                if (iVar11 == 0) {
                  this = (LPCMStreamReader *)operator_new(0x4490);
                  LPCMStreamReader::LPCMStreamReader(this);
                  goto LAB_001a70bf;
                }
                iVar11 = std::__cxx11::string::compare((char *)codecName);
                if (iVar11 != 0) {
                  iVar11 = std::__cxx11::string::compare((char *)codecName);
                  if (iVar11 == 0) {
                    this = (LPCMStreamReader *)operator_new(0x150);
                    DTSStreamReader::DTSStreamReader((DTSStreamReader *)this);
                    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_270,"down-to-dts","");
                    cVar19 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::find(&addParams->_M_t,local_270);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                      operator_delete(local_270[0]._M_dataplus._M_p,
                                      local_270[0].field_2._M_allocated_capacity + 1);
                    }
                    if ((_Rb_tree_header *)cVar19._M_node !=
                        &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                      this->m_tmpFrameBuffer[7] = '\x01';
                    }
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)codecName);
                    if (iVar11 == 0) {
                      this = (LPCMStreamReader *)operator_new(0x1c8);
                      AC3StreamReader::AC3StreamReader((AC3StreamReader *)this);
                      local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"down-to-ac3","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node !=
                          &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                        this->m_tmpFrameBuffer[6] = '\x01';
                      }
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)codecName);
                      if (iVar11 != 0) {
                        iVar11 = std::__cxx11::string::compare((char *)codecName);
                        if (iVar11 != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,"Unsupported codec ",0x12);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,(codecName->_M_dataplus)._M_p,
                                     codecName->_M_string_length);
                          puVar23 = (undefined4 *)__cxa_allocate_exception(0x28);
                          std::__cxx11::stringbuf::str();
                          *puVar23 = 0x1f5;
                          *(undefined4 **)(puVar23 + 2) = puVar23 + 6;
                          if (local_78 == &local_68) {
                            puVar23[6] = local_68;
                            puVar23[7] = uStack_64;
                            puVar23[8] = uStack_60;
                            puVar23[9] = uStack_5c;
                          }
                          else {
                            *(uint **)(puVar23 + 2) = local_78;
                            *(ulong *)(puVar23 + 6) = CONCAT44(uStack_64,local_68);
                          }
                          *(undefined8 *)(puVar23 + 4) = local_70;
                          local_70 = 0;
                          local_68 = local_68 & 0xffffff00;
                          local_78 = &local_68;
                          __cxa_throw(puVar23,&VodCoreException::typeinfo,
                                      VodCoreException::~VodCoreException);
                        }
                        this = (LPCMStreamReader *)operator_new(0x188);
                        SRTStreamReader::SRTStreamReader((SRTStreamReader *)this);
                        local_f8 = &local_e8;
                        local_f0 = 0;
                        local_e8 = '\0';
                        local_d8 = 0x12;
                        uStack_d0 = 0;
                        local_c8 = 0x3f80000000ffffff;
                        local_b8[0].fadeInDuration = 0.0;
                        local_b8[0].fadeOutDuration = 0.0;
                        p_Var18 = (addParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                        if ((_Rb_tree_header *)p_Var18 != p_Var1) {
                          local_c0 = 0.0;
                          uVar9 = 0;
                          uVar10 = 0;
                          do {
                            p_Var2 = p_Var18 + 1;
                            iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                            if (iVar11 == 0) {
                              unquoteStr(local_270,(string *)(p_Var18 + 2));
                              std::__cxx11::string::operator=
                                        ((string *)&local_f8,(string *)local_270);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
                                operator_delete(local_270[0]._M_dataplus._M_p,
                                                local_270[0].field_2._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                              if (iVar11 == 0) {
                                iVar16 = strToInt32(*(char **)(p_Var18 + 2));
                                local_d8 = CONCAT44(local_d8._4_4_,iVar16);
                              }
                              else {
                                iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                if (iVar11 == 0) {
                                  local_d8 = local_d8 | 0x100000000;
                                }
                                else {
                                  iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                  if (iVar11 == 0) {
                                    local_d8 = local_d8 | 0x200000000;
                                  }
                                  else {
                                    iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                    if (iVar11 == 0) {
                                      local_d8 = local_d8 | 0x400000000;
                                    }
                                    else {
                                      iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                      if (iVar11 == 0) {
                                        local_d8 = local_d8 | 0x800000000;
                                      }
                                      else {
                                        iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                        if (iVar11 == 0) {
                                          p_Var2 = p_Var18 + 2;
                                          if (p_Var18[2]._M_parent < (_Base_ptr)0x2) {
                                            str = *(char **)p_Var2;
                                            if (p_Var18[2]._M_parent != (_Base_ptr)0x0) {
                                              cVar7 = *str;
                                              goto LAB_001a6c30;
                                            }
LAB_001a6c7f:
                                            uVar14 = strToInt32u(str,10);
                                            local_c8 = CONCAT44(local_c8._4_4_,uVar14);
                                          }
                                          else {
                                            str = *(char **)p_Var2;
                                            cVar7 = *str;
                                            if (cVar7 == '0') {
                                              if (str[1] != 'x') goto LAB_001a6c7f;
                                              std::__cxx11::string::substr
                                                        ((ulong)local_270,(ulong)p_Var2);
                                              uVar12 = strToInt32u(local_270[0]._M_dataplus._M_p,
                                                                   0x10);
                                            }
                                            else {
LAB_001a6c30:
                                              if (cVar7 != 'x') goto LAB_001a6c7f;
                                              std::__cxx11::string::substr
                                                        ((ulong)local_270,(ulong)p_Var2);
                                              uVar12 = strToInt32u(local_270[0]._M_dataplus._M_p,
                                                                   0x10);
                                            }
                                            local_c8 = CONCAT44(local_c8._4_4_,uVar12);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_270[0]._M_dataplus._M_p !=
                                                &local_270[0].field_2) {
                                              operator_delete(local_270[0]._M_dataplus._M_p,
                                                              local_270[0].field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                            uVar14 = (uint)local_c8;
                                          }
                                          if (uVar14 < 0x1000000) {
                                            local_c8 = CONCAT44(local_c8._4_4_,uVar14) | 0xff000000;
                                          }
                                        }
                                        else {
                                          iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                          if (iVar11 == 0) {
                                            fVar25 = strToFloat(*(char **)(p_Var18 + 2));
                                            local_c8 = CONCAT44(fVar25,(uint)local_c8);
                                          }
                                          else {
                                            iVar11 = std::__cxx11::string::compare((char *)p_Var2);
                                            if (iVar11 == 0) {
                                              iVar16 = strToInt32(*(char **)(p_Var18 + 2));
                                              uStack_d0 = CONCAT44(iVar16,(undefined4)uStack_d0);
                                            }
                                            else {
                                              iVar11 = std::__cxx11::string::compare((char *)p_Var2)
                                              ;
                                              if (iVar11 == 0) {
                                                fVar25 = strToFloat(*(char **)(p_Var18 + 2));
                                                uStack_d0 = CONCAT44(uStack_d0._4_4_,fVar25);
                                              }
                                              else {
                                                iVar11 = std::__cxx11::string::compare
                                                                   ((char *)p_Var2);
                                                if (iVar11 == 0) {
                                                  local_c0 = strToDouble(*(char **)(p_Var18 + 2));
                                                }
                                                else {
                                                  iVar11 = std::__cxx11::string::compare
                                                                     ((char *)p_Var2);
                                                  if (iVar11 == 0) {
                                                    uVar9 = strToInt16u(*(char **)(p_Var18 + 2));
                                                  }
                                                  else {
                                                    iVar11 = std::__cxx11::string::compare
                                                                       ((char *)p_Var2);
                                                    if (iVar11 == 0) {
                                                      uVar10 = strToInt16u(*(char **)(p_Var18 + 2));
                                                    }
                                                    else {
                                                      iVar11 = std::__cxx11::string::compare
                                                                         ((char *)p_Var2);
                                                      if (iVar11 == 0) {
                                                        iVar16 = strToInt32(*(char **)(p_Var18 + 2))
                                                        ;
                                                        (*(TextToPGSConverter **)
                                                          &((MPEGStreamReader *)
                                                           &this->super_SimplePacketizerReader)->
                                                           m_eof)->m_bottomOffset = iVar16;
                                                      }
                                                      else {
                                                        iVar11 = std::__cxx11::string::compare
                                                                           ((char *)p_Var2);
                                                        if (iVar11 == 0) {
                                                          fVar25 = strToFloat(*(char **)(p_Var18 + 2
                                                                                        ));
                                                          local_b8[0].fadeInDuration = fVar25;
                                                        }
                                                        else {
                                                          iVar11 = std::__cxx11::string::compare
                                                                             ((char *)p_Var2);
                                                          if (iVar11 == 0) {
                                                            fVar25 = strToFloat(*(char **)(p_Var18 +
                                                                                          2));
                                                            local_b8[0].fadeOutDuration = fVar25;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
                          } while ((_Rb_tree_header *)p_Var18 != p_Var1);
                          if (((uVar9 != 0) && (uVar10 != 0)) &&
                             ((local_c0 != 0.0 || (NAN(local_c0))))) {
                            SRTStreamReader::setVideoInfo
                                      ((SRTStreamReader *)this,uVar9,uVar10,local_c0);
                            pTVar5 = (*(TextToPGSConverter **)
                                       &((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                                        m_eof)->m_textRender;
                            (*pTVar5->_vptr_TextSubtitlesRender[2])(pTVar5,&local_f8);
                            SRTStreamReader::setAnimation((SRTStreamReader *)this,local_b8);
                            if (local_f8 != &local_e8) {
                              operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
                            }
                            goto LAB_001a70bf;
                          }
                        }
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_270,
                                   "video-width, video-height and fps parameters MUST be provided for SRT tracks"
                                   ,0x4c);
                        puVar23 = (undefined4 *)__cxa_allocate_exception(0x28);
                        std::__cxx11::stringbuf::str();
                        *puVar23 = 3;
                        *(undefined4 **)(puVar23 + 2) = puVar23 + 6;
                        if (local_58 == &local_48) {
                          puVar23[6] = local_48;
                          puVar23[7] = uStack_44;
                          puVar23[8] = uStack_40;
                          puVar23[9] = uStack_3c;
                        }
                        else {
                          *(uint **)(puVar23 + 2) = local_58;
                          *(ulong *)(puVar23 + 6) = CONCAT44(uStack_44,local_48);
                        }
                        *(undefined8 *)(puVar23 + 4) = local_50;
                        local_50 = 0;
                        local_48 = local_48 & 0xffffff00;
                        local_58 = &local_48;
                        __cxa_throw(puVar23,&VodCoreException::typeinfo,
                                    VodCoreException::~VodCoreException);
                      }
                      this = (LPCMStreamReader *)operator_new(0x1e8);
                      PGSStreamReader::PGSStreamReader((PGSStreamReader *)this);
                      paVar4 = &local_270[0].field_2;
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"bottom-offset","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                      if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
                        pLVar24 = (LPCMStreamReader *)0x0;
                        if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                            super_AbstractStreamReader).super_BaseAbstractStreamReader.
                            _vptr_BaseAbstractStreamReader ==
                            (_func_int **)&PTR__PGSStreamReader_0023f208) {
                          pLVar24 = this;
                        }
                        iVar16 = strToInt32(*(char **)(cVar19._M_node + 2));
                        *(int32_t *)(*(long *)(pLVar24->m_tmpFrameBuffer + 0x69) + 0xc) = iVar16;
                      }
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"3d-plane","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
                        pLVar24 = (LPCMStreamReader *)0x0;
                        if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                            super_AbstractStreamReader).super_BaseAbstractStreamReader.
                            _vptr_BaseAbstractStreamReader ==
                            (_func_int **)&PTR__PGSStreamReader_0023f208) {
                          pLVar24 = this;
                        }
                        uVar8 = strToInt8u(*(char **)(cVar19._M_node + 2));
                        pLVar24->m_tmpFrameBuffer[0xff] = uVar8;
                      }
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
                        uVar26 = 0;
                        uVar27 = 0;
                      }
                      else {
                        dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
                        uVar26 = SUB84(dVar6,0);
                        uVar27 = (undefined4)((ulong)dVar6 >> 0x20);
                      }
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"video-width","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
                        uVar10 = 0;
                      }
                      else {
                        uVar10 = strToInt16u(*(char **)(cVar19._M_node + 2));
                      }
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"video-height","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
                        uVar9 = 0;
                      }
                      else {
                        uVar9 = strToInt16u(*(char **)(cVar19._M_node + 2));
                      }
                      PGSStreamReader::setVideoInfo
                                ((PGSStreamReader *)this,uVar10,uVar9,
                                 (double)CONCAT44(uVar27,uVar26));
                      local_270[0]._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_270,"font-border","");
                      cVar19 = std::
                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::find(&addParams->_M_t,local_270);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270[0]._M_dataplus._M_p != paVar4) {
                        operator_delete(local_270[0]._M_dataplus._M_p,
                                        local_270[0].field_2._M_allocated_capacity + 1);
                      }
                      if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
                        pLVar24 = (LPCMStreamReader *)0x0;
                        if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                            super_AbstractStreamReader).super_BaseAbstractStreamReader.
                            _vptr_BaseAbstractStreamReader ==
                            (_func_int **)&PTR__PGSStreamReader_0023f208) {
                          pLVar24 = this;
                        }
                        iVar16 = strToInt32(*(char **)(cVar19._M_node + 2));
                        *(int32_t *)
                         ((long)&((MPEGStreamReader *)&pLVar24->super_SimplePacketizerReader)->
                                 m_testPulldownDts + 4) = iVar16;
                      }
                    }
                  }
                  goto LAB_001a70bf;
                }
                this = (LPCMStreamReader *)operator_new(0x100);
                SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
                *(undefined1 *)&((iterator *)&this->m_headerType)->_M_cur = 0;
                this->m_tmpFrameBuffer[0xd] = '\0';
                this->m_tmpFrameBuffer[0xe] = '\0';
                this->m_tmpFrameBuffer[0xf] = '\0';
                this->m_tmpFrameBuffer[0x10] = '\0';
                this->m_tmpFrameBuffer[0x11] = '\0';
                this->m_tmpFrameBuffer[0x12] = '\0';
                this->m_tmpFrameBuffer[0x13] = '\0';
                this->m_tmpFrameBuffer[0x14] = '\0';
                this->m_useNewStyleAudioPES = false;
                this->m_testMode = false;
                this->m_firstFrame = false;
                this->m_tmpFrameBuffer[0] = '\0';
                this->m_tmpFrameBuffer[1] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                this->m_tmpFrameBuffer[2] = '\0';
                this->m_tmpFrameBuffer[3] = '\0';
                this->m_tmpFrameBuffer[4] = '\0';
                this->m_tmpFrameBuffer[5] = '\0';
                this->m_tmpFrameBuffer[6] = '\0';
                this->m_tmpFrameBuffer[7] = '\0';
                this->m_tmpFrameBuffer[8] = '\0';
                this->m_tmpFrameBuffer[9] = '\0';
                (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_0023e378
                ;
              }
              this->m_tmpFrameBuffer[0x19] = '\0';
              this->m_tmpFrameBuffer[0x1a] = '\0';
              this->m_tmpFrameBuffer[0x1b] = '\0';
              this->m_tmpFrameBuffer[0x1c] = '\0';
              this->m_tmpFrameBuffer[0x1d] = '\0';
              this->m_tmpFrameBuffer[0x1e] = '\0';
              this->m_tmpFrameBuffer[0x1f] = '\0';
              this->m_tmpFrameBuffer[0x20] = '\0';
              goto LAB_001a70bf;
            }
            this = (LPCMStreamReader *)operator_new(0xf8);
            memset(this,0,0xf8);
            SimplePacketizerReader::SimplePacketizerReader((SimplePacketizerReader *)this);
            this->m_tmpFrameBuffer[0xd] = '\0';
            this->m_tmpFrameBuffer[0xe] = '\0';
            this->m_tmpFrameBuffer[0xf] = '\0';
            this->m_tmpFrameBuffer[0x10] = '\0';
            this->m_tmpFrameBuffer[0x11] = '\0';
            this->m_tmpFrameBuffer[0x12] = '\0';
            this->m_tmpFrameBuffer[0x13] = '\0';
            this->m_tmpFrameBuffer[0x14] = '\0';
            ((iterator *)&this->m_headerType)->_M_cur = (_Elt_pointer)0x0;
            *(_Elt_pointer *)(this->m_tmpFrameBuffer + 1) = (_Elt_pointer)0x0;
            this->m_tmpFrameBuffer[9] = 0;
            puVar22 = &MpegAudioStreamReader::vtable;
          }
          (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
          super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader =
               (_func_int **)(puVar22 + 0x10);
        }
      }
      goto LAB_001a70bf;
    }
    this = (LPCMStreamReader *)operator_new(400);
    VVCStreamReader::VVCStreamReader((VVCStreamReader *)this);
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"fps","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
    dVar6 = strToDouble(*(char **)(cVar19._M_node + 2));
    dVar6 = correctFps(dVar6);
    puVar21 = (pointer)0x0;
    if (0.0 < dVar6) {
      puVar21 = (pointer)(long)(5292000000.0 / dVar6);
    }
    ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar6;
    (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
     &((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame)->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = puVar21;
    ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField =
         (int64_t)((long)puVar21 / 2);
  }
LAB_001a70bf:
  if (*(codecName->_M_dataplus)._M_p == 'A') {
    local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"stretch","");
    cVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
      operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar19._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var3 = cVar19._M_node + 2;
      lVar20 = std::__cxx11::string::find((char)p_Var3,0x2f);
      if (lVar20 == -1) {
        local_280 = strToDouble(*(char **)p_Var3);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)p_Var3);
        std::__cxx11::string::substr((ulong)local_b8,(ulong)p_Var3);
        local_280 = strToDouble(local_f8);
        dVar6 = strToDouble((char *)local_b8[0]);
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_270,"Second argument at stretch parameter can not be 0",0x31);
          puVar23 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar23 = 3;
          *(undefined4 **)(puVar23 + 2) = puVar23 + 6;
          if (local_98 == &local_88) {
            puVar23[6] = local_88;
            puVar23[7] = uStack_84;
            puVar23[8] = uStack_80;
            puVar23[9] = uStack_7c;
          }
          else {
            *(uint **)(puVar23 + 2) = local_98;
            *(ulong *)(puVar23 + 6) = CONCAT44(uStack_84,local_88);
          }
          *(undefined8 *)(puVar23 + 4) = local_90;
          local_90 = 0;
          local_88 = local_88 & 0xffffff00;
          local_98 = &local_88;
          __cxa_throw(puVar23,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        if (local_b8[0] != (TextAnimation)local_a8) {
          operator_delete((void *)local_b8[0],local_a8[0] + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
        }
        local_280 = local_280 / dVar6;
      }
      lVar20 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&SimplePacketizerReader::typeinfo
                              ,0);
      *(double *)(lVar20 + 0x60) = local_280;
    }
  }
  paVar4 = &local_270[0].field_2;
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"secondary","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar19._M_node != p_Var1) {
    (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
    m_secondary = true;
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipCorner","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
    PVar13 = TopLeft;
  }
  else {
    PVar13 = pipCornerFromStr((string *)(cVar19._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipHOffset","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
    uVar14 = 0;
  }
  else {
    uVar14 = strToInt32((string *)(cVar19._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipVOffset","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
    uVar15 = 0;
  }
  else {
    uVar15 = strToInt32((string *)(cVar19._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipLumma","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
    iVar16 = 3;
  }
  else {
    iVar16 = strToInt32((string *)(cVar19._M_node + 2));
  }
  local_270[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"pipScale","");
  cVar19 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar19._M_node == p_Var1) {
    iVar11 = 1;
  }
  else {
    iVar11 = pipScaleFromStr((string *)(cVar19._M_node + 2));
  }
  mplsInfo_00 = local_38;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.scaleIndex = iVar11;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.corner = PVar13;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.hOffset = uVar14;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.vOffset = uVar15;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.lumma = iVar16;
  if (((local_38->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (local_38->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     (this_00 = (SimplePacketizerReader *)
                __dynamic_cast(this,&AbstractStreamReader::typeinfo,
                               &SimplePacketizerReader::typeinfo,0),
     this_00 != (SimplePacketizerReader *)0x0)) {
    SimplePacketizerReader::setMPLSInfo(this_00,mplsInfo_00);
  }
  return (AbstractStreamReader *)this;
}

Assistant:

AbstractStreamReader* METADemuxer::createCodec(const string& codecName, const map<string, string>& addParams,
                                               const std::string& codecStreamName, const vector<MPLSPlayItem>& mplsInfo)
{
    AbstractStreamReader* rez = nullptr;
    if (codecName == "V_MPEG4/ISO/AVC" || codecName == "V_MPEG4/ISO/MVC")
    {
        auto h264Reader = new H264StreamReader();
        rez = h264Reader;
        if (codecName == "V_MPEG4/ISO/MVC")
            h264Reader->setIsSubStream(true);

        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<H264StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setRemovePulldown(true);

        itr = addParams.find("level");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setForceLevel(static_cast<uint8_t>(strToDouble(itr->second.c_str())) *
                                                                10);
        itr = addParams.find("insertSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("autoSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("forceSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertForce);
        }
        itr = addParams.find("contSPS");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setH264SPSCont(true);
        }
    }
    else if (codecName == "V_MPEGH/ISO/HEVC")
    {
        rez = new HEVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<HEVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MPEGI/ISO/VVC")
    {
        rez = new VVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MS/VFW/WVC1")
    {
        rez = new VC1StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VC1StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<VC1StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "V_MPEG-2")
    {
        rez = new MPEG2StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<MPEG2StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("ar");
        if (itr != addParams.end())
            dynamic_cast<MPEGStreamReader*>(rez)->setAspectRatio(arNameToCode(itr->second));

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<MPEG2StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "A_AAC")
        rez = new AACStreamReader();
    else if (codecName == "A_MP3")
        rez = new MpegAudioStreamReader();
    else if (codecName == "S_SUP")
        rez = new DVBSubStreamReader();
    else if (codecName == "A_LPCM")
        rez = new LPCMStreamReader();
    else if (codecName == "A_MLP")
        rez = new MLPStreamReader();
    else if (codecName == "A_DTS")
    {
        rez = new DTSStreamReader();
        auto itr = addParams.find("down-to-dts");
        if (itr != addParams.end())
            dynamic_cast<DTSStreamReader*>(rez)->setDownconvertToDTS(true);
    }
    else if (codecName == "A_AC3")
    {
        rez = new AC3StreamReader();
        auto itr = addParams.find("down-to-ac3");
        if (itr != addParams.end())
            dynamic_cast<AC3StreamReader*>(rez)->setDownconvertToAC3(true);
    }
    else if (codecName == "S_HDMV/PGS")
    {
        rez = new PGSStreamReader();
        auto itr = addParams.find("bottom-offset");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setBottomOffset(strToInt32(itr->second.c_str()));

        itr = addParams.find("3d-plane");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setOffsetId(strToInt8u(itr->second.c_str()));

        double fps = 0.0;
        uint16_t width = 0;
        uint16_t height = 0;
        itr = addParams.find("fps");
        if (itr != addParams.end())
            fps = strToDouble(itr->second.c_str());
        itr = addParams.find("video-width");
        if (itr != addParams.end())
            width = strToInt16u(itr->second.c_str());
        itr = addParams.find("video-height");
        if (itr != addParams.end())
            height = strToInt16u(itr->second.c_str());
        dynamic_cast<PGSStreamReader*>(rez)->setVideoInfo(width, height, fps);
        itr = addParams.find("font-border");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setFontBorder(strToInt32(itr->second.c_str()));
    }
    else if (codecName == "S_TEXT/UTF8")
    {
        auto srtReader = new SRTStreamReader();
        rez = srtReader;
        text_subtitles::Font font;
        uint16_t srtWidth = 0, srtHeight = 0;
        double fps = 0.0;
        text_subtitles::TextAnimation animation;
        for (const auto& addParam : addParams)
        {
            if (addParam.first == "font-name")
            {
                font.m_name = unquoteStr(addParam.second);
            }
            else if (addParam.first == "font-size")
                font.m_size = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-bold")
                font.m_opts |= text_subtitles::Font::BOLD;
            else if (addParam.first == "font-italic")
                font.m_opts |= text_subtitles::Font::ITALIC;
            else if (addParam.first == "font-underline")
                font.m_opts |= text_subtitles::Font::UNDERLINE;
            else if (addParam.first == "font-strike-out")
                font.m_opts |= text_subtitles::Font::STRIKE_OUT;
            else if (addParam.first == "font-color")
            {
                const string& s = addParam.second;
                if (s.size() >= 2 && s[0] == '0' && s[1] == 'x')
                    font.m_color = strToInt32u(s.substr(2, s.size() - 2).c_str(), 16);
                else if (!s.empty() && s[0] == 'x')
                    font.m_color = strToInt32u(s.substr(1, s.size() - 1).c_str(), 16);
                else
                    font.m_color = strToInt32u(s.c_str());
                if ((font.m_color & 0xff000000u) == 0)
                    font.m_color |= 0xff000000u;
            }
            else if (addParam.first == "line-spacing")
                font.m_lineSpacing = strToFloat(addParam.second.c_str());
            else if (addParam.first == "font-charset")
                font.m_charset = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-border")
                font.m_borderWidth = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fps")
            {
                fps = strToDouble(addParam.second.c_str());
            }
            else if (addParam.first == "video-width")
                srtWidth = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "video-height")
                srtHeight = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "bottom-offset")
                srtReader->setBottomOffset(strToInt32(addParam.second.c_str()));
            else if (addParam.first == "fadein-time")
                animation.fadeInDuration = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fadeout-time")
                animation.fadeOutDuration = strToFloat(addParam.second.c_str());
        }
        if (srtWidth == 0 || srtHeight == 0 || fps == 0.0)
            THROW(ERR_COMMON, "video-width, video-height and fps parameters MUST be provided for SRT tracks")
        srtReader->setVideoInfo(srtWidth, srtHeight, fps);
        srtReader->setFont(font);
        srtReader->setAnimation(animation);
    }
    else
        THROW(ERR_UNKNOWN_CODEC, "Unsupported codec " << codecName)

    if (codecName[0] == 'A')
    {
        auto itr = addParams.find("stretch");
        if (itr != addParams.end())
        {
            double stretch;
            size_t divPos = itr->second.find('/');
            if (divPos == std::string::npos)
                stretch = strToDouble(itr->second.c_str());
            else
            {
                string firstStr = itr->second.substr(0, divPos);
                string secondStr = itr->second.substr(divPos + 1, itr->second.size() - divPos - 1);
                double dFirst = strToDouble(firstStr.c_str());
                double dSecond = strToDouble(secondStr.c_str());
                if (dSecond != 0.0)
                    stretch = dFirst / dSecond;
                else
                    THROW(ERR_COMMON, "Second argument at stretch parameter can not be 0")
            }
            if (itr != addParams.end())
                dynamic_cast<SimplePacketizerReader*>(rez)->setStretch(stretch);
        }
    }
    auto itr = addParams.find("secondary");
    if (itr != addParams.end())
        rez->setIsSecondary(true);

    PIPParams pipParams;
    itr = addParams.find("pipCorner");
    if (itr != addParams.end())
        pipParams.corner = pipCornerFromStr(itr->second);
    itr = addParams.find("pipHOffset");
    if (itr != addParams.end())
        pipParams.hOffset = strToInt32(itr->second);
    itr = addParams.find("pipVOffset");
    if (itr != addParams.end())
        pipParams.vOffset = strToInt32(itr->second);
    itr = addParams.find("pipLumma");
    if (itr != addParams.end())
        pipParams.lumma = strToInt32(itr->second);
    itr = addParams.find("pipScale");
    if (itr != addParams.end())
        pipParams.scaleIndex = pipScaleFromStr(itr->second);
    rez->setPipParams(pipParams);

    if (!mplsInfo.empty() && dynamic_cast<SimplePacketizerReader*>(rez))
        dynamic_cast<SimplePacketizerReader*>(rez)->setMPLSInfo(mplsInfo);

    return rez;
}